

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O1

void test_statisticstracker(void)

{
  int iVar1;
  runtime_error *prVar2;
  stringstream msg;
  StatisticsTracker tracker;
  string asStack_2e8 [32];
  string local_2c8;
  long *local_2a8 [2];
  long local_298 [47];
  undefined1 local_120 [168];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [2];
  double local_40;
  StatisticsTrackerOptions local_34;
  
  local_34.histogramOptions.binCount = 100;
  local_34.histogramOptions.cacheSize = 1000;
  local_34.histogramOptions.enabled = false;
  local_34.doCov = true;
  local_34.doMax = true;
  local_34.doMean = true;
  local_34.doMin = true;
  local_34.doVar = true;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"test","");
  StatisticsTracker::StatisticsTracker
            ((StatisticsTracker *)local_120,&local_2c8,0,0.0,0.0,0.0,0.0,&local_34);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  StatisticsTracker::update((StatisticsTracker *)local_120,1.0);
  StatisticsTracker::update((StatisticsTracker *)local_120,2.0);
  StatisticsTracker::update((StatisticsTracker *)local_120,3.0);
  StatisticsTracker::update((StatisticsTracker *)local_120,4.0);
  StatisticsTracker::update((StatisticsTracker *)local_120,5.0);
  if (local_120._0_8_ != 5) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"StatisticsTracker::getCount failed",0x22);
    std::endl<char,std::char_traits<char>>((ostream *)local_298);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,asStack_2e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((double)local_120._160_8_ != 1.0) || (NAN((double)local_120._160_8_))) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"StatisticsTracker::getMin failed",0x20);
    std::endl<char,std::char_traits<char>>((ostream *)local_298);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,asStack_2e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((double)local_120._152_8_ != 3.0) || (NAN((double)local_120._152_8_))) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"StatisticsTracker::getMean failed",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)local_298);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,asStack_2e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((double)local_120._144_8_ != 5.0) || (NAN((double)local_120._144_8_))) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"StatisticsTracker::getMax failed",0x20);
    std::endl<char,std::char_traits<char>>((ostream *)local_298);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,asStack_2e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,local_78._M_p,local_78._M_p + local_70);
  iVar1 = std::__cxx11::string::compare((string *)local_2a8,"test");
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"StatisticsTracker::getName failed",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)local_298);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,asStack_2e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_40 != 2.0) || (NAN(local_40))) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"StatisticsTracker::getVariance failed",0x25);
    std::endl<char,std::char_traits<char>>((ostream *)local_298);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,asStack_2e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"test2","");
  std::__cxx11::string::_M_assign((string *)&local_78,(string *)local_2a8);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,local_78._M_p,local_78._M_p + local_70);
  iVar1 = std::__cxx11::string::compare((string *)local_2a8,"test2");
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != local_68) {
      operator_delete(local_78._M_p,local_68[0]._M_allocated_capacity + 1);
    }
    DynamicHistogram<double>::~DynamicHistogram((DynamicHistogram<double> *)(local_120 + 8));
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"StatisticsTracker::setName failed",0x21);
  std::endl<char,std::char_traits<char>>((ostream *)local_298);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar2,asStack_2e8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_statisticstracker()
{

    StatisticsTrackerOptions options;
    options.doCov = options.doMax = options.doMean = options.doMin = options.doVar = true;
    
    StatisticsTracker tracker("test", 0, 0, 0, 0, 0, options);
    tracker.update(1);
    tracker.update(2);
    tracker.update(3);
    tracker.update(4);
    tracker.update(5);

    ASSERT_EQUAL(tracker.getCount(), 5, "StatisticsTracker::getCount failed");
    ASSERT_EQUAL(tracker.getMinimum(), 1, "StatisticsTracker::getMin failed");
    ASSERT_EQUAL(tracker.getMean(), 3, "StatisticsTracker::getMean failed");
    ASSERT_EQUAL(tracker.getMaximum(), 5, "StatisticsTracker::getMax failed");
    ASSERT_EQUAL(tracker.getName(), "test", "StatisticsTracker::getName failed");
    ASSERT_EQUAL(tracker.getVariance(), 2, "StatisticsTracker::getVariance failed");
    
    tracker.setName("test2");
    ASSERT_EQUAL(tracker.getName(), "test2", "StatisticsTracker::setName failed");

}